

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O3

bool __thiscall CConnman::DisconnectNode(CConnman *this,NodeId id)

{
  long lVar1;
  CNode *pCVar2;
  bool bVar3;
  pointer ppCVar4;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  NodeId local_30;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock95;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock95.super_unique_lock._M_device = &(this->m_nodes_mutex).super_recursive_mutex;
  criticalblock95.super_unique_lock._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&criticalblock95.super_unique_lock);
  ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (ppCVar4 ==
        (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar3 = false;
LAB_001ae2f0:
      std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock95.super_unique_lock);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return bVar3;
      }
      __stack_chk_fail();
    }
    pCVar2 = *ppCVar4;
    if (pCVar2->id == id) {
      this_00 = LogInstance();
      bVar3 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
      if (bVar3) {
        local_30 = pCVar2->id;
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/net.cpp"
        ;
        source_file._M_len = 0x57;
        logging_function._M_str = "DisconnectNode";
        logging_function._M_len = 0xe;
        LogPrintFormatInternal<long>
                  (logging_function,source_file,0xe37,NET,Debug,(ConstevalFormatString<1U>)0x7d2d3a,
                   &local_30);
      }
      bVar3 = true;
      LOCK();
      (pCVar2->fDisconnect)._M_base._M_i = true;
      UNLOCK();
      goto LAB_001ae2f0;
    }
    ppCVar4 = ppCVar4 + 1;
  } while( true );
}

Assistant:

bool CConnman::DisconnectNode(NodeId id)
{
    LOCK(m_nodes_mutex);
    for(CNode* pnode : m_nodes) {
        if (id == pnode->GetId()) {
            LogDebug(BCLog::NET, "disconnect by id peer=%d; disconnecting\n", pnode->GetId());
            pnode->fDisconnect = true;
            return true;
        }
    }
    return false;
}